

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O2

DdNode * cuddBddSqueeze(DdManager *dd,DdNode *l,DdNode *u)

{
  uint uVar1;
  uint uVar2;
  DdNode *g;
  int iVar3;
  DdNode *pDVar4;
  uint *puVar5;
  DdNode *pDVar6;
  DdNode *data;
  ulong uVar7;
  DdNode *pDVar8;
  uint index;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *f;
  DdNode *local_68;
  
  if (l == u) {
    return l;
  }
  pDVar6 = dd->one;
  pDVar10 = (DdNode *)((ulong)pDVar6 ^ 1);
  if (pDVar10 == l) {
    return l;
  }
  if (pDVar6 == u) {
    return u;
  }
  uVar7 = (ulong)u & 1;
  f = (DdNode *)((ulong)u & 0xfffffffffffffffe);
  g = (DdNode *)((ulong)l ^ 1);
  if (uVar7 == 0) {
    f = l;
    g = u;
  }
  pDVar4 = cuddCacheLookup2(dd,Cudd_bddSqueeze,f,g);
  if (pDVar4 != (DdNode *)0x0) {
LAB_0061841e:
    return (DdNode *)(uVar7 ^ (ulong)pDVar4);
  }
  uVar1 = dd->perm[g->index];
  puVar5 = (uint *)((ulong)f & 0xfffffffffffffffe);
  uVar2 = dd->perm[*puVar5];
  pDVar4 = g;
  local_68 = g;
  index = *puVar5;
  if (uVar1 <= uVar2) {
    local_68 = (g->type).kids.T;
    pDVar4 = (g->type).kids.E;
    index = g->index;
  }
  pDVar8 = f;
  pDVar9 = f;
  if (uVar2 <= uVar1) {
    pDVar8 = *(DdNode **)(puVar5 + 4);
    pDVar9 = *(DdNode **)(puVar5 + 6);
    if (((ulong)f & 1) != 0) {
      pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
      pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
    }
  }
  if (((pDVar8 == pDVar10) || (iVar3 = Cudd_bddLeq(dd,pDVar8,pDVar9), iVar3 != 0)) &&
     ((local_68 == pDVar6 || (iVar3 = Cudd_bddLeq(dd,pDVar4,local_68), iVar3 != 0)))) {
    pDVar6 = cuddBddSqueeze(dd,pDVar9,pDVar4);
    if (pDVar6 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    return (DdNode *)(uVar7 ^ (ulong)pDVar6);
  }
  if ((pDVar9 == pDVar10) || (iVar3 = Cudd_bddLeq(dd,pDVar9,pDVar8), iVar3 != 0)) {
    if ((pDVar4 == pDVar6) || (iVar3 = Cudd_bddLeq(dd,local_68,pDVar4), iVar3 != 0)) {
      pDVar4 = cuddBddSqueeze(dd,pDVar8,local_68);
      if (pDVar4 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      goto LAB_0061841e;
    }
    if (pDVar9 != pDVar10) goto LAB_00618582;
LAB_006185a0:
    if ((pDVar4 != pDVar6) &&
       (iVar3 = Cudd_bddLeq(dd,(DdNode *)((ulong)pDVar8 ^ 1),pDVar4), iVar3 == 0))
    goto LAB_00618616;
    pDVar6 = cuddBddSqueeze(dd,pDVar8,local_68);
    pDVar10 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
    pDVar10->ref = pDVar10->ref + 1;
    if (((ulong)pDVar6 & 1) == 0) {
      pDVar4 = cuddUniqueInter(dd,index,pDVar6,(DdNode *)((ulong)pDVar6 | 1));
      if (pDVar4 != (DdNode *)0x0) goto LAB_006186e6;
      goto LAB_0061887f;
    }
    pDVar4 = cuddUniqueInter(dd,index,pDVar10,pDVar6);
    if (pDVar4 == (DdNode *)0x0) goto LAB_0061887f;
    pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
LAB_006186e6:
    pDVar10->ref = pDVar10->ref - 1;
joined_r0x006186ed:
    if (pDVar4 != (DdNode *)0x0) {
      cuddCacheInsert2(dd,Cudd_bddSqueeze,f,g,pDVar4);
      return (DdNode *)(uVar7 ^ (ulong)pDVar4);
    }
  }
  else {
LAB_00618582:
    iVar3 = Cudd_bddLeq(dd,pDVar9,(DdNode *)((ulong)local_68 ^ 1));
    if (iVar3 != 0) goto LAB_006185a0;
LAB_00618616:
    if (((pDVar8 == pDVar10) ||
        (iVar3 = Cudd_bddLeq(dd,pDVar8,(DdNode *)((ulong)pDVar4 ^ 1)), iVar3 != 0)) &&
       ((local_68 == pDVar6 ||
        (iVar3 = Cudd_bddLeq(dd,(DdNode *)((ulong)pDVar9 ^ 1),local_68), iVar3 != 0)))) {
      pDVar6 = cuddBddSqueeze(dd,pDVar9,pDVar4);
      pDVar10 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
      pDVar10->ref = pDVar10->ref + 1;
      if (((ulong)pDVar6 & 1) == 0) {
        pDVar4 = cuddUniqueInter(dd,index,pDVar6,(DdNode *)((ulong)pDVar6 | 1));
        if (pDVar4 != (DdNode *)0x0) {
          pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
LAB_006187bb:
          pDVar10->ref = pDVar10->ref - 1;
          goto joined_r0x006186ed;
        }
      }
      else {
        pDVar4 = cuddUniqueInter(dd,index,pDVar10,pDVar6);
        if (pDVar4 != (DdNode *)0x0) goto LAB_006187bb;
      }
    }
    else {
      pDVar6 = cuddBddSqueeze(dd,pDVar8,local_68);
      if (pDVar6 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      pDVar8 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
      pDVar8->ref = pDVar8->ref + 1;
      pDVar10 = cuddBddSqueeze(dd,pDVar9,pDVar4);
      if (pDVar10 != (DdNode *)0x0) {
        pDVar4 = (DdNode *)((ulong)pDVar10 & 0xfffffffffffffffe);
        pDVar4->ref = pDVar4->ref + 1;
        if (((ulong)pDVar6 & 1) == 0) {
          pDVar9 = pDVar8;
          data = pDVar6;
          if ((pDVar6 == pDVar10) ||
             (data = cuddUniqueInter(dd,index,pDVar6,pDVar10), pDVar9 = pDVar4,
             data != (DdNode *)0x0)) {
LAB_00618837:
            pDVar8->ref = pDVar8->ref - 1;
            pDVar9->ref = pDVar9->ref - 1;
            cuddCacheInsert2(dd,Cudd_bddSqueeze,f,g,data);
            return (DdNode *)(uVar7 ^ (ulong)data);
          }
          Cudd_IterDerefBdd(dd,pDVar10);
        }
        else {
          pDVar10 = (DdNode *)((ulong)pDVar10 ^ 1);
          pDVar6 = pDVar8;
          if ((pDVar8 == pDVar10) ||
             (pDVar6 = cuddUniqueInter(dd,index,pDVar8,pDVar10), pDVar6 != (DdNode *)0x0)) {
            pDVar9 = pDVar4;
            data = (DdNode *)((ulong)pDVar6 ^ 1);
            goto LAB_00618837;
          }
          Cudd_IterDerefBdd(dd,pDVar10);
          pDVar6 = pDVar8;
        }
      }
    }
LAB_0061887f:
    Cudd_IterDerefBdd(dd,pDVar6);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
cuddBddSqueeze(
  DdManager * dd,
  DdNode * l,
  DdNode * u)
{
    DdNode *one, *zero, *r, *lt, *le, *ut, *ue, *t, *e;
#if 0
    DdNode *ar;
#endif
    int comple = 0;
    unsigned int topu, topl;
    int index;

    statLine(dd);
    if (l == u) {
        return(l);
    }
    one = DD_ONE(dd);
    zero = Cudd_Not(one);
    /* The only case when l == zero && u == one is at the top level,
    ** where returning either one or zero is OK. In all other cases
    ** the procedure will detect such a case and will perform
    ** remapping. Therefore the order in which we test l and u at this
    ** point is immaterial. */
    if (l == zero) return(l);
    if (u == one)  return(u);

    /* Make canonical to increase the utilization of the cache. */
    if (Cudd_IsComplement(u)) {
        DdNode *temp;
        temp = Cudd_Not(l);
        l = Cudd_Not(u);
        u = temp;
        comple = 1;
    }
    /* At this point u is regular and non-constant; l is non-constant, but
    ** may be complemented. */

    /* Here we could check the relative sizes. */

    /* Check the cache. */
    r = cuddCacheLookup2(dd, Cudd_bddSqueeze, l, u);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    /* Recursive step. */
    topu = dd->perm[u->index];
    topl = dd->perm[Cudd_Regular(l)->index];
    if (topu <= topl) {
        index = u->index;
        ut = cuddT(u); ue = cuddE(u);
    } else {
        index = Cudd_Regular(l)->index;
        ut = ue = u;
    }
    if (topl <= topu) {
        lt = cuddT(Cudd_Regular(l)); le = cuddE(Cudd_Regular(l));
        if (Cudd_IsComplement(l)) {
            lt = Cudd_Not(lt);
            le = Cudd_Not(le);
        }
    } else {
        lt = le = l;
    }

    /* If one interval is contained in the other, use the smaller
    ** interval. This corresponds to one-sided matching. */
    if ((lt == zero || Cudd_bddLeq(dd,lt,le)) &&
        (ut == one  || Cudd_bddLeq(dd,ue,ut))) { /* remap */
        r = cuddBddSqueeze(dd, le, ue);
        if (r == NULL)
            return(NULL);
        return(Cudd_NotCond(r,comple));
    } else if ((le == zero || Cudd_bddLeq(dd,le,lt)) &&
               (ue == one  || Cudd_bddLeq(dd,ut,ue))) { /* remap */
        r = cuddBddSqueeze(dd, lt, ut);
        if (r == NULL)
            return(NULL);
        return(Cudd_NotCond(r,comple));
    } else if ((le == zero || Cudd_bddLeq(dd,le,Cudd_Not(ut))) &&
               (ue == one  || Cudd_bddLeq(dd,Cudd_Not(lt),ue))) { /* c-remap */
        t = cuddBddSqueeze(dd, lt, ut);
        cuddRef(t);
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(dd, index, Cudd_Not(t), t);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(dd, index, t, Cudd_Not(t));
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
        }
        cuddDeref(t);
        if (r == NULL)
            return(NULL);
        cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
        return(Cudd_NotCond(r,comple));
    } else if ((lt == zero || Cudd_bddLeq(dd,lt,Cudd_Not(ue))) &&
               (ut == one  || Cudd_bddLeq(dd,Cudd_Not(le),ut))) { /* c-remap */
        e = cuddBddSqueeze(dd, le, ue);
        cuddRef(e);
        if (Cudd_IsComplement(e)) {
            r = cuddUniqueInter(dd, index, Cudd_Not(e), e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                return(NULL);
            }
        } else {
            r = cuddUniqueInter(dd, index, e, Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        }
        cuddDeref(e);
        if (r == NULL)
            return(NULL);
        cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
        return(Cudd_NotCond(r,comple));
    }

#if 0
    /* If the two intervals intersect, take a solution from
    ** the intersection of the intervals. This guarantees that the
    ** splitting variable will not appear in the result.
    ** This approach corresponds to two-sided matching, and is very
    ** expensive. */
    if (Cudd_bddLeq(dd,lt,ue) && Cudd_bddLeq(dd,le,ut)) {
        DdNode *au, *al;
        au = cuddBddAndRecur(dd,ut,ue);
        if (au == NULL)
            return(NULL);
        cuddRef(au);
        al = cuddBddAndRecur(dd,Cudd_Not(lt),Cudd_Not(le));
        if (al == NULL) {
            Cudd_IterDerefBdd(dd,au);
            return(NULL);
        }
        cuddRef(al);
        al = Cudd_Not(al);
        ar = cuddBddSqueeze(dd, al, au);
        if (ar == NULL) {
            Cudd_IterDerefBdd(dd,au);
            Cudd_IterDerefBdd(dd,al);
            return(NULL);
        }
        cuddRef(ar);
        Cudd_IterDerefBdd(dd,au);
        Cudd_IterDerefBdd(dd,al);
    } else {
        ar = NULL;
    }
#endif

    t = cuddBddSqueeze(dd, lt, ut);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);
    e = cuddBddSqueeze(dd, le, ue);
    if (e == NULL) {
        Cudd_IterDerefBdd(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, e);
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, e);
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

#if 0
    /* Check whether there is a result obtained by abstraction and whether
    ** it is better than the one obtained by recursion. */
    cuddRef(r);
    if (ar != NULL) {
        if (Cudd_DagSize(ar) <= Cudd_DagSize(r)) {
            Cudd_IterDerefBdd(dd, r);
            r = ar;
        } else {
            Cudd_IterDerefBdd(dd, ar);
        }
    }
    cuddDeref(r);
#endif

    cuddCacheInsert2(dd, Cudd_bddSqueeze, l, u, r);
    return(Cudd_NotCond(r,comple));

}